

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cautious_this_capture_cpp_pre17.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  anon_class_32_1_66b8a3d0 print;
  Prefixer prefixer;
  long *local_80;
  long local_78;
  long local_70 [2];
  long *local_60;
  long local_58;
  long local_50 [2];
  long *local_40;
  undefined8 local_38;
  long local_30;
  undefined2 local_28;
  undefined1 local_26;
  
  local_30 = 0x676e697465657247;
  local_28 = 0x2c73;
  local_38 = 10;
  local_26 = 0;
  local_60 = local_50;
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,&local_30);
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Mortals","");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_80,local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"!\n",2);
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  return 0;
}

Assistant:

int main() {
  Prefixer prefixer;
  auto print = prefixer.printer();
  print("Mortals");
}